

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

uint32_t asm_x86_inslen(uint8_t *p)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  iVar5 = 0;
  uVar6 = 0;
LAB_0013c8cc:
  pbVar4 = map_op1 + *p;
  do {
    bVar1 = *pbVar4;
    do {
    } while (9 < bVar1 >> 4);
    uVar2 = (uint)bVar1;
    switch(bVar1 >> 4) {
    case 0:
      return (uVar6 & 4) + iVar5 + uVar2;
    case 1:
      goto switchD_0013c8ec_caseD_1;
    case 2:
      pbVar4 = p + 1;
      p = p + 1;
      pbVar4 = map_op2 + *pbVar4;
      break;
    case 3:
      uVar3 = (*(code *)(&DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[2] >> 6) * 4)))
                        (p + 1,&DAT_00163678,
                         &DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[2] >> 6) * 4));
      return uVar3;
    case 4:
      iVar5 = iVar5 - (uVar6 & 2);
    case 5:
      return (uVar2 & 0xf) + iVar5;
    case 6:
      if ((p[1] & 0x38) == 0) {
        uVar7 = 4;
        if (uVar2 != 0x66) {
          uVar7 = uVar2;
        }
        if ((uVar6 & 2) == 0) {
          uVar7 = uVar2;
        }
        uVar3 = (*(code *)(&DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[1] >> 6) * 4)))
                          (p,(uVar7 & 0xf) + iVar5,&DAT_00163678,p[1],
                           &DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[1] >> 6) * 4));
        return uVar3;
      }
    case 9:
      uVar3 = (*(code *)(&DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[1] >> 6) * 4)))
                        (p,&DAT_00163678,
                         &DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[1] >> 6) * 4));
      return uVar3;
    case 7:
      if (bVar1 == 0x70) {
        if (1 < (p[1] & 0x1f)) {
          uVar3 = (*(code *)(&DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[4] >> 6) * 4)))
                            (p + 3,&DAT_00163678,
                             &DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[4] >> 6) * 4));
          return uVar3;
        }
        p = p + 1;
        iVar5 = iVar5 + 1;
      }
      iVar5 = iVar5 + 1;
      pbVar4 = p + 2;
      p = p + 2;
      pbVar4 = map_op2 + *pbVar4;
      break;
    case 8:
      uVar3 = (*(code *)(&DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[1] >> 6) * 4)))
                        (p,&DAT_00163678,
                         &DAT_00163678 + *(int *)(&DAT_00163678 + (ulong)(p[1] >> 6) * 4));
      return uVar3;
    }
  } while( true );
switchD_0013c8ec_caseD_1:
  uVar6 = uVar6 | uVar2;
  p = p + 1;
  iVar5 = iVar5 + 1;
  goto LAB_0013c8cc;
}

Assistant:

static uint32_t asm_x86_inslen(const uint8_t* p)
{
  uint32_t result = 0;
  uint32_t prefixes = 0;
  uint32_t x = map_op1[*p];
  for (;;) {
    switch (x >> 4) {
    case 0: return result + x + (prefixes & 4);
    case 1: prefixes |= x; x = map_op1[*++p]; result++; break;
    case 2: x = map_op2[*++p]; break;
    case 3: p++; goto mrm;
    case 4: result -= (prefixes & 2);  /* fallthrough */
    case 5: return result + (x & 15);
    case 6:  /* Group 3. */
      if (p[1] & 0x38) x = 2;
      else if ((prefixes & 2) && (x == 0x66)) x = 4;
      goto mrm;
    case 7: /* VEX c4/c5. */
      if (LJ_32 && p[1] < 0xc0) {
	x = 2;
	goto mrm;
      }
      if (x == 0x70) {
	x = *++p & 0x1f;
	result++;
	if (x >= 2) {
	  p += 2;
	  result += 2;
	  goto mrm;
	}
      }
      p++;
      result++;
      x = map_op2[*++p];
      break;
    case 8: result -= (prefixes & 2);  /* fallthrough */
    case 9: mrm:  /* ModR/M and possibly SIB. */
      result += (x & 15);
      x = *++p;
      switch (x >> 6) {
      case 0: if ((x & 7) == 5) return result + 4; break;
      case 1: result++; break;
      case 2: result += 4; break;
      case 3: return result;
      }
      if ((x & 7) == 4) {
	result++;
	if (x < 0x40 && (p[1] & 7) == 5) result += 4;
      }
      return result;
    }
  }
}